

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::updateBindlessQualifier(TParseContext *this,TType *memberType)

{
  pointer pTVar1;
  TIntermediate *pTVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  TTypeList *pTVar6;
  undefined4 extraout_var;
  mapped_type *pmVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar4 = (*memberType->_vptr_TType[0x37])(memberType);
  if ((char)iVar4 != '\0') {
    iVar4 = (*memberType->_vptr_TType[0x25])(memberType);
    if ((char)iVar4 == '\0') {
      iVar4 = (*memberType->_vptr_TType[9])(memberType);
      bVar3 = TSampler::isImage((TSampler *)CONCAT44(extraout_var,iVar4));
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if (bVar3) {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
                 ::operator[](&pTVar2->bindlessImageModeCaller,&this->currentCaller);
        *pmVar7 = AstRefTypeLayout;
        iVar4 = (*memberType->_vptr_TType[10])(memberType);
        *(undefined1 *)(CONCAT44(extraout_var_00,iVar4) + 0x49) = 1;
      }
      else {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
                 ::operator[](&pTVar2->bindlessTextureModeCaller,&this->currentCaller);
        *pmVar7 = AstRefTypeLayout;
        iVar4 = (*memberType->_vptr_TType[10])(memberType);
        *(undefined1 *)(CONCAT44(extraout_var_01,iVar4) + 0x48) = 1;
      }
    }
    else {
      pTVar6 = TType::getWritableStruct(memberType);
      uVar5 = 0;
      while( true ) {
        pTVar1 = (pTVar6->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pTVar6->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ).
                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 5) <=
            (ulong)uVar5) break;
        updateBindlessQualifier(this,pTVar1[uVar5].type);
        uVar5 = uVar5 + 1;
      }
    }
  }
  return;
}

Assistant:

void TParseContext::updateBindlessQualifier(TType& memberType)
{
    if (memberType.containsSampler()) {
        if (memberType.isStruct()) {
            TTypeList* typeList = memberType.getWritableStruct();
            for (unsigned int member = 0; member < typeList->size(); ++member) {
                TType* subMemberType = (*typeList)[member].type;
                updateBindlessQualifier(*subMemberType);
            }
        }
        else if (memberType.getSampler().isImage()) {
            intermediate.setBindlessImageMode(currentCaller, AstRefTypeLayout);
            memberType.getQualifier().layoutBindlessImage = true;
        }
        else {
            intermediate.setBindlessTextureMode(currentCaller, AstRefTypeLayout);
            memberType.getQualifier().layoutBindlessSampler = true;
        }
    }
}